

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketMonitorTestCase.cpp
# Opt level: O0

void __thiscall
SuiteSocketMonitorTests::TestUnsignal_SocketDoesNotExist_WriteSocketErased::
TestUnsignal_SocketDoesNotExist_WriteSocketErased
          (TestUnsignal_SocketDoesNotExist_WriteSocketErased *this)

{
  char *suiteName;
  TestUnsignal_SocketDoesNotExist_WriteSocketErased *this_local;
  
  suiteName = SuiteSocketMonitorTests::UnitTestSuite::GetSuiteName();
  UnitTest::Test::Test
            (&this->super_Test,"Unsignal_SocketDoesNotExist_WriteSocketErased",suiteName,
             "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/test/SocketMonitorTestCase.cpp"
             ,0x5f);
  (this->super_Test)._vptr_Test =
       (_func_int **)&PTR__TestUnsignal_SocketDoesNotExist_WriteSocketErased_0045bdb0;
  return;
}

Assistant:

TEST(Unsignal_SocketDoesNotExist_WriteSocketErased)
{
  SocketMonitor monitor;
  TestStrategy strategy;

  int socket = 101;
  monitor.addRead(socket);
  monitor.addConnect(socket);

  monitor.signal(socket);
  monitor.unsignal(socket);

  socket_close(socket);
}